

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptStruct(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  EHlslTokenClass tokenClass;
  char *pcVar6;
  TSymbol *pTVar7;
  int b;
  long lVar8;
  HlslGrammar *this_00;
  ulong uVar9;
  long lVar10;
  ulong local_e0;
  TTypeList *typeList;
  TVector<glslang::TFunctionDeclarator> functionDeclarators;
  TString structName;
  TQualifier local_80;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokCBuffer);
  if (bVar2) {
    local_e0 = 5;
    uVar9 = 0;
  }
  else {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokTBuffer);
    if (!bVar2) {
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokClass);
      if ((!bVar2) &&
         (bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokStruct),
         !bVar2)) {
        return false;
      }
      bVar2 = true;
      uVar9 = 0;
      local_e0 = 0;
      goto LAB_00333b31;
    }
    local_e0 = 6;
    uVar9 = 0x800000000000;
  }
  bVar2 = false;
LAB_00333b31:
  this_00 = this;
  tokenClass = HlslTokenStream::peek(&this->super_HlslTokenStream);
  pcVar6 = getTypeString(this_00,tokenClass);
  local_80.semanticName = (char *)GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&structName,
             "",(pool_allocator<char> *)&local_80);
  bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIdentifier);
  if ((pcVar6 != (char *)0x0) || (bVar3)) {
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&structName,(this->super_HlslTokenStream).token.field_2.string);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=(&structName,*pcVar6);
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  TQualifier::clear(&local_80);
  bVar3 = acceptPostDecls(this,&local_80);
  bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar4) {
    TVector<glslang::TFunctionDeclarator>::TVector(&functionDeclarators);
    HlslParseContext::pushNamespace(this->parseContext,&structName);
    bVar3 = acceptStructDeclarationList(this,&typeList,nodeList,&functionDeclarators);
    HlslParseContext::popNamespace(this->parseContext);
    if (bVar3) {
      bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
      if (bVar3) {
        if (bVar2) {
          TType::TType(type,typeList,&structName);
        }
        else {
          local_80._8_8_ = local_e0 | uVar9 | local_80._8_8_ & 0xffff7fffffffff80;
          TType::TType(type,typeList,&structName,&local_80);
        }
        HlslParseContext::declareStruct
                  (this->parseContext,&(this->super_HlslTokenStream).token.loc,&structName,type);
        lVar10 = 0x18;
        for (lVar8 = 0;
            lVar8 < (int)(((long)functionDeclarators.
                                 super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 .
                                 super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)functionDeclarators.
                                super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                .
                                super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
            lVar8 = lVar8 + 1) {
          cVar5 = (**(code **)(**(long **)((long)&((functionDeclarators.
                                                                                                        
                                                  super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  .
                                                  super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->loc).
                                                  name + lVar10) + 0x108))();
          if (cVar5 != '\0') {
            plVar1 = *(long **)((long)&((functionDeclarators.
                                         super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                         .
                                         super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->loc).name +
                               lVar10);
            (**(code **)(*plVar1 + 0xb8))(plVar1,type,this->intermediate->implicitThisName);
          }
          lVar10 = lVar10 + 0x48;
        }
        HlslParseContext::pushNamespace(this->parseContext,&structName);
        HlslParseContext::pushThisScope(this->parseContext,type,&functionDeclarators);
        bVar2 = true;
        lVar8 = 0;
        lVar10 = 0;
        while ((lVar10 < (int)(((long)functionDeclarators.
                                      super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                      .
                                      super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)functionDeclarators.
                                     super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                     .
                                     super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x48) &&
               (bVar2 != false))) {
          HlslTokenStream::pushTokenStream
                    (&this->super_HlslTokenStream,
                     *(TVector<glslang::HlslToken> **)
                      ((long)&(functionDeclarators.
                               super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               .
                               super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               ._M_impl.super__Vector_impl_data._M_start)->body + lVar8));
          bVar2 = acceptFunctionBody(this,(TFunctionDeclarator *)
                                          ((long)&((functionDeclarators.
                                                                                                        
                                                  super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  .
                                                  super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->loc).
                                                  name + lVar8),nodeList);
          HlslTokenStream::popTokenStream(&this->super_HlslTokenStream);
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 0x48;
        }
        HlslParseContext::popThisScope(this->parseContext);
        HlslParseContext::popNamespace(this->parseContext);
        return bVar2;
      }
      pcVar6 = "}";
    }
    else {
      pcVar6 = "struct member declarations";
    }
  }
  else {
    if ((!bVar3 && structName._M_string_length != 0) &&
       (pTVar7 = HlslParseContext::lookupUserType(this->parseContext,&structName,type),
       pTVar7 != (TSymbol *)0x0)) {
      return true;
    }
    pcVar6 = "{";
  }
  expected(this,pcVar6);
  return false;
}

Assistant:

bool HlslGrammar::acceptStruct(TType& type, TIntermNode*& nodeList)
{
    // This storage qualifier will tell us whether it's an AST
    // block type or just a generic structure type.
    TStorageQualifier storageQualifier = EvqTemporary;
    bool readonly = false;

    if (acceptTokenClass(EHTokCBuffer)) {
        // CBUFFER
        storageQualifier = EvqUniform;
    } else if (acceptTokenClass(EHTokTBuffer)) {
        // TBUFFER
        storageQualifier = EvqBuffer;
        readonly = true;
    } else if (! acceptTokenClass(EHTokClass) && ! acceptTokenClass(EHTokStruct)) {
        // Neither CLASS nor STRUCT
        return false;
    }

    // Now known to be one of CBUFFER, TBUFFER, CLASS, or STRUCT


    // IDENTIFIER.  It might also be a keyword which can double as an identifier.
    // For example:  'cbuffer ConstantBuffer' or 'struct ConstantBuffer' is legal.
    // 'cbuffer int' is also legal, and 'struct int' appears rejected only because
    // it attempts to redefine the 'int' type.
    const char* idString = getTypeString(peek());
    TString structName = "";
    if (peekTokenClass(EHTokIdentifier) || idString != nullptr) {
        if (idString != nullptr)
            structName = *idString;
        else
            structName = *token.string;
        advanceToken();
    }

    // post_decls
    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    bool postDeclsFound = acceptPostDecls(postDeclQualifier);

    // LEFT_BRACE, or
    // struct_type IDENTIFIER
    if (! acceptTokenClass(EHTokLeftBrace)) {
        if (structName.size() > 0 && !postDeclsFound && parseContext.lookupUserType(structName, type) != nullptr) {
            // struct_type IDENTIFIER
            return true;
        } else {
            expected("{");
            return false;
        }
    }


    // struct_declaration_list
    TTypeList* typeList;
    // Save each member function so they can be processed after we have a fully formed 'this'.
    TVector<TFunctionDeclarator> functionDeclarators;

    parseContext.pushNamespace(structName);
    bool acceptedList = acceptStructDeclarationList(typeList, nodeList, functionDeclarators);
    parseContext.popNamespace();

    if (! acceptedList) {
        expected("struct member declarations");
        return false;
    }

    // RIGHT_BRACE
    if (! acceptTokenClass(EHTokRightBrace)) {
        expected("}");
        return false;
    }

    // create the user-defined type
    if (storageQualifier == EvqTemporary)
        new(&type) TType(typeList, structName);
    else {
        postDeclQualifier.storage = storageQualifier;
        postDeclQualifier.readonly = readonly;
        new(&type) TType(typeList, structName, postDeclQualifier); // sets EbtBlock
    }

    parseContext.declareStruct(token.loc, structName, type);

    // For member functions: now that we know the type of 'this', go back and
    // - add their implicit argument with 'this' (not to the mangling, just the argument list)
    // - parse the functions, their tokens were saved for deferred parsing (now)
    for (int b = 0; b < (int)functionDeclarators.size(); ++b) {
        // update signature
        if (functionDeclarators[b].function->hasImplicitThis())
            functionDeclarators[b].function->addThisParameter(type, intermediate.implicitThisName);
    }

    // All member functions get parsed inside the class/struct namespace and with the
    // class/struct members in a symbol-table level.
    parseContext.pushNamespace(structName);
    parseContext.pushThisScope(type, functionDeclarators);
    bool deferredSuccess = true;
    for (int b = 0; b < (int)functionDeclarators.size() && deferredSuccess; ++b) {
        // parse body
        pushTokenStream(functionDeclarators[b].body);
        if (! acceptFunctionBody(functionDeclarators[b], nodeList))
            deferredSuccess = false;
        popTokenStream();
    }
    parseContext.popThisScope();
    parseContext.popNamespace();

    return deferredSuccess;
}